

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O1

bool __thiscall DListMenu::MenuEvent(DListMenu *this,int mkey,bool fromcontroller)

{
  uint uVar1;
  FListMenuDescriptor *pFVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FSoundID *sound_id;
  FSoundID local_24 [3];
  
  uVar1 = this->mDesc->mSelectedItem;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  if (mkey == 0) {
    do {
      pFVar2 = this->mDesc;
      iVar4 = pFVar2->mSelectedItem;
      pFVar2->mSelectedItem = iVar4 + -1;
      if (iVar4 < 1) {
        pFVar2->mSelectedItem =
             (pFVar2->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count - 1;
      }
      iVar4 = (*(pFVar2->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array
                [pFVar2->mSelectedItem]->_vptr_FListMenuItem[5])();
    } while (((char)iVar4 == '\0') && (this->mDesc->mSelectedItem != uVar5));
    if (this->mDesc->mSelectedItem == uVar5) {
      this->mDesc->mSelectedItem = uVar1;
    }
    iVar4 = S_FindSound("menu/cursor");
    sound_id = local_24 + 2;
  }
  else if (mkey == 6) {
    if ((int)uVar1 < 0) {
      return true;
    }
    iVar4 = (*(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar1]->
              _vptr_FListMenuItem[6])();
    if ((char)iVar4 == '\0') {
      return true;
    }
    iVar4 = S_FindSound("menu/choose");
    sound_id = local_24;
  }
  else {
    if (mkey != 1) {
      bVar3 = DMenu::MenuEvent(&this->super_DMenu,mkey,fromcontroller);
      return bVar3;
    }
    do {
      pFVar2 = this->mDesc;
      iVar4 = pFVar2->mSelectedItem + 1;
      if ((int)(pFVar2->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count <= iVar4) {
        iVar4 = 0;
      }
      pFVar2->mSelectedItem = iVar4;
      iVar4 = (*(pFVar2->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[iVar4]->
                _vptr_FListMenuItem[5])();
    } while (((char)iVar4 == '\0') && (this->mDesc->mSelectedItem != uVar5));
    if (this->mDesc->mSelectedItem == uVar5) {
      this->mDesc->mSelectedItem = uVar1;
    }
    iVar4 = S_FindSound("menu/cursor");
    sound_id = local_24 + 1;
  }
  sound_id->ID = iVar4;
  S_Sound(0x22,sound_id,snd_menuvolume.Value,0.0);
  return true;
}

Assistant:

bool DListMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int oldSelect = mDesc->mSelectedItem;
	int startedAt = mDesc->mSelectedItem;
	if (startedAt < 0) startedAt = 0;

	switch (mkey)
	{
	case MKEY_Up:
		do
		{
			if (--mDesc->mSelectedItem < 0) mDesc->mSelectedItem = mDesc->mItems.Size()-1;
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		if (mDesc->mSelectedItem == startedAt) mDesc->mSelectedItem = oldSelect;
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
		return true;

	case MKEY_Down:
		do
		{
			if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size()) mDesc->mSelectedItem = 0;
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		if (mDesc->mSelectedItem == startedAt) mDesc->mSelectedItem = oldSelect;
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
		return true;

	case MKEY_Enter:
		if (mDesc->mSelectedItem >= 0 && mDesc->mItems[mDesc->mSelectedItem]->Activate())
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		}
		return true;

	default:
		return Super::MenuEvent(mkey, fromcontroller);
	}
}